

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O2

void conn_drop(conn_handle *conn)

{
  mutex_handle *mutex;
  void *pvVar1;
  
  pvVar1 = conn->priv;
  mutex = (mutex_handle *)((long)pvVar1 + 0x90);
  mutex_lock_shared(mutex);
  if (*(int *)((long)pvVar1 + 4) == -1) {
    if (*(int *)((long)pvVar1 + 8) == -1) {
      mutex_unlock_shared(mutex);
      return;
    }
  }
  else {
    shutdown(*(int *)((long)pvVar1 + 4),2);
  }
  mutex_unlock_shared(mutex);
  mutex_lock(mutex);
  *(undefined4 *)((long)pvVar1 + 8) = 0xffffffff;
  if (*(int *)((long)pvVar1 + 4) != -1) {
    close(*(int *)((long)pvVar1 + 4));
    *(undefined4 *)((long)pvVar1 + 4) = 0xffffffff;
  }
  mutex_unlock(mutex);
  return;
}

Assistant:

void conn_drop(struct conn_handle *conn)
{
	struct conn_priv *priv = conn->priv;

	/* First, shutdown any active connections */
	mutex_lock_shared(&priv->mutex);

	if (priv->conn_fd == INVALID_SOCKET && priv->fd == INVALID_SOCKET) {
		/* Nothing to do here */
		mutex_unlock_shared(&priv->mutex);

		return;
	}

	if (priv->conn_fd != INVALID_SOCKET)
		shutdown(priv->conn_fd, SHUT_RDWR);

	mutex_unlock_shared(&priv->mutex);

	/* Now that we know there will be no one blocking while
	 * holding the shared lock, we can get the exclusive lock
	 * and close the descriptors
	 */
	mutex_lock(&priv->mutex);

	priv->fd = INVALID_SOCKET;

	if (priv->conn_fd != INVALID_SOCKET) {
		closesocket(priv->conn_fd);
		priv->conn_fd = INVALID_SOCKET;
	}

	mutex_unlock(&priv->mutex);
}